

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void CVmBifTADS::get_func_params(uint argc)

{
  int iVar1;
  uint intval;
  undefined4 in_EDI;
  vm_val_t val;
  CVmObjList *lst;
  vm_obj_id_t lst_obj;
  CVmFuncPtr hdr;
  size_t in_stack_ffffffffffffffc8;
  vm_datatype_t in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  CVmFuncPtr in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff8;
  
  CVmBif::check_argc(0,0x2a5f26);
  CVmFuncPtr::CVmFuncPtr((CVmFuncPtr *)&stack0xfffffffffffffff0);
  CVmStack::get(0);
  iVar1 = CVmFuncPtr::set((CVmFuncPtr *)CONCAT44(in_EDI,in_stack_fffffffffffffff8),
                          (vm_val_t *)in_stack_fffffffffffffff0.p_);
  if (iVar1 == 0) {
    err_throw(0);
  }
  CVmObjList::create(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  vm_objp(0);
  iVar1 = CVmFuncPtr::get_min_argc((CVmFuncPtr *)0x2a5f7d);
  vm_val_t::set_int((vm_val_t *)&stack0xffffffffffffffd0,iVar1);
  CVmObjList::cons_set_element
            ((CVmObjList *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8,(vm_val_t *)0x2a5f9c);
  intval = CVmFuncPtr::get_opt_argc((CVmFuncPtr *)&stack0xfffffffffffffff0);
  vm_val_t::set_int((vm_val_t *)&stack0xffffffffffffffd0,intval);
  CVmObjList::cons_set_element
            ((CVmObjList *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8,(vm_val_t *)0x2a5fc6);
  iVar1 = CVmFuncPtr::is_varargs((CVmFuncPtr *)0x2a5fd0);
  vm_val_t::set_logical((vm_val_t *)&stack0xffffffffffffffd0,iVar1);
  CVmObjList::cons_set_element
            ((CVmObjList *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8,(vm_val_t *)0x2a5ff0);
  CVmBif::retval_obj(0);
  return;
}

Assistant:

void CVmBifTADS::get_func_params(VMG_ uint argc)
{
    /* check arguments */
    check_argc(vmg_ argc, 1);

    /* set up a method header pointer for the function pointer argument */
    CVmFuncPtr hdr;
    if (!hdr.set(vmg_ G_stk->get(0)))
        err_throw(VMERR_FUNCPTR_VAL_REQD);

    /* 
     *   Allocate our return list.  We need three elements: [minArgs,
     *   optionalArgs, isVarargs].  
     */
    vm_obj_id_t lst_obj = CVmObjList::create(vmg_ FALSE, 3);

    /* get the list object, properly cast */
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ lst_obj);

    /* set the minimum argument count */
    vm_val_t val;
    val.set_int(hdr.get_min_argc());
    lst->cons_set_element(0, &val);

    /* set the optional argument count */
    val.set_int(hdr.get_opt_argc());
    lst->cons_set_element(1, &val);

    /* set the varargs flag */
    val.set_logical(hdr.is_varargs());
    lst->cons_set_element(2, &val);

    /* return the list */
    retval_obj(vmg_ lst_obj);
}